

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O0

void __thiscall xray_re::xr_custom_object::save(xr_custom_object *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_custom_object *this_local;
  
  xr_writer::w_chunk<unsigned_int>(w,0xf906,&this->m_flags);
  xr_writer::w_chunk(w,0xf907,&this->m_name);
  xr_writer::open_chunk(w,0xf903);
  xr_writer::w_fvector3(w,&this->m_position);
  xr_writer::w_fvector3(w,&this->m_rotation);
  xr_writer::w_fvector3(w,&this->m_scale);
  xr_writer::close_chunk(w);
  if ((this->m_flags & 8) != 0) {
    if (this->m_motion == (xr_obj_motion *)0x0) {
      __assert_fail("m_motion",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x56,"virtual void xray_re::xr_custom_object::save(xr_writer &) const");
    }
    xr_writer::open_chunk(w,0xf905);
    (*(this->m_motion->super_xr_motion)._vptr_xr_motion[3])(this->m_motion,w);
    xr_writer::close_chunk(w);
    xr_writer::w_chunk<float>(w,0xf908,&this->m_time);
  }
  return;
}

Assistant:

void xr_custom_object::save(xr_writer& w) const
{
	w.w_chunk(CUSTOMOBJECT_CHUNK_FLAGS, m_flags);
	w.w_chunk(CUSTOMOBJECT_CHUNK_NAME, m_name);

	w.open_chunk(CUSTOMOBJECT_CHUNK_XFORM);
	w.w_fvector3(m_position);
	w.w_fvector3(m_rotation);
	w.w_fvector3(m_scale);
	w.close_chunk();

	if (m_flags & COF_MOTIONABLE) {
		xr_assert(m_motion);
		w.open_chunk(CUSTOMOBJECT_CHUNK_MOTION);
		m_motion->save(w);
		w.close_chunk();

		w.w_chunk<float>(CUSTOMOBJECT_CHUNK_TIME, m_time);
	}
}